

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O0

void Prn_gen<Blob<256>>(int nbRn,pfHash hash,vector<Blob<256>,_std::allocator<Blob<256>_>_> *hashes)

{
  code *in_RSI;
  int in_EDI;
  Blob<256> h;
  int i;
  Blob<256> hcopy;
  undefined1 local_5c [4];
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  int local_3c;
  Blob<256> local_38;
  code *local_10;
  int local_4;
  
  local_10 = in_RSI;
  local_4 = in_EDI;
  printf("Generating %i random numbers : \n");
  Blob<256>::Blob(&local_38);
  memset(&local_38,0,0x20);
  for (local_3c = 0; local_3c < local_4; local_3c = local_3c + 1) {
    Blob<256>::Blob((Blob<256> *)local_5c);
    (*local_10)(&local_38,0x20,0,local_5c);
    std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::push_back
              ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (value_type *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  }
  return;
}

Assistant:

void Prn_gen (int nbRn, pfHash hash, std::vector<hashtype> & hashes )
{
  assert(nbRn < 0);

  printf("Generating %i random numbers : \n", nbRn);

  hashtype hcopy;
  memset(&hcopy, 0, sizeof(hcopy));

  // a generated random number becomes the input for the next one
  for (int i=0; i< nbRn; i++) {
      hashtype h;
      hash(&hcopy, sizeof(hcopy), 0, &h);
      hashes.push_back(h);
      memcpy(&hcopy, &h, sizeof(h));
  }
}